

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O2

TestLog * deqp::gles2::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,StencilParams *params)

{
  ostringstream *stream;
  ostringstream *this;
  MessageBuilder *this_00;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  this = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"  func = ");
  local_1c0.m_value = params->function;
  local_1c0.m_getName = glu::getCompareFuncName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this);
  std::operator<<((ostream *)this,"\n");
  std::operator<<((ostream *)this,"  ref = ");
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&params->reference);
  stream = &this_00->m_str;
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"  compare mask = ");
  hex.value._4_4_ = 0;
  hex.value._0_4_ = params->compareMask;
  tcu::Format::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,hex);
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"  stencil fail = ");
  local_1d0.m_value = params->stencilFailOp;
  local_1d0.m_getName = glu::getStencilOpName;
  tcu::Format::Enum<int,_2UL>::toStream
            (&local_1d0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"  depth fail = ");
  local_1e0.m_value = params->depthFailOp;
  local_1e0.m_getName = glu::getStencilOpName;
  tcu::Format::Enum<int,_2UL>::toStream
            (&local_1e0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"  depth pass = ");
  local_1f0.m_value = params->depthPassOp;
  local_1f0.m_getName = glu::getStencilOpName;
  tcu::Format::Enum<int,_2UL>::toStream
            (&local_1f0,&stream->super_basic_ostream<char,_std::char_traits<char>_>);
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"  write mask = ");
  hex_00.value._4_4_ = 0;
  hex_00.value._0_4_ = params->writeMask;
  tcu::Format::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,hex_00);
  std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const StencilParams& params)
{
	log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.function) << "\n"
							<< "  ref = " << params.reference << "\n"
							<< "  compare mask = " << tcu::toHex(params.compareMask) << "\n"
							<< "  stencil fail = " << glu::getStencilOpStr(params.stencilFailOp) << "\n"
							<< "  depth fail = " << glu::getStencilOpStr(params.depthFailOp) << "\n"
							<< "  depth pass = " << glu::getStencilOpStr(params.depthPassOp) << "\n"
							<< "  write mask = " << tcu::toHex(params.writeMask) << "\n"
		<< TestLog::EndMessage;
	return log;
}